

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((*z == '0') && ((byte)(z[1] | 0x20U) == 0x78)) {
    uVar3 = 1;
    do {
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (z[lVar1] == '0');
    iVar2 = (int)uVar3;
    uVar7 = (ulong)(byte)z[uVar3 & 0xffffffff];
    if ((""[uVar7] & 8) == 0) {
      uVar6 = 0;
      uVar3 = uVar3 & 0xffffffff;
      iVar5 = iVar2;
    }
    else {
      uVar6 = 0;
      do {
        uVar6 = (ulong)(((char)((char)uVar7 * '\x02') >> 7 & 9U) + (char)uVar7 & 0xf) | uVar6 << 4;
        uVar7 = (ulong)(byte)z[uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while ((""[uVar7] & 8) != 0);
      iVar5 = (int)uVar3;
    }
    *pOut = uVar6;
    return (uint)(0x10 < iVar5 - iVar2 || z[uVar3] != '\0') * 2;
  }
  sVar4 = strlen(z);
  iVar2 = sqlite3Atoi64(z,pOut,(uint)sVar4 & 0x3fffffff,'\x01');
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    return (z[k]==0 && k-i<=16) ? 0 : 2;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    return sqlite3Atoi64(z, pOut, sqlite3Strlen30(z), SQLITE_UTF8);
  }
}